

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O0

void __thiscall spv::Block::dump(Block *this,Vector<unsigned_int> *out)

{
  const_reference pvVar1;
  pointer pIVar2;
  size_type sVar3;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  Vector<unsigned_int> *out_local;
  Block *this_local;
  
  pvVar1 = std::
           vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
           ::operator[](&this->instructions,0);
  pIVar2 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (pvVar1);
  Instruction::dump(pIVar2,out);
  local_1c = 0;
  while( true ) {
    sVar3 = std::
            vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
            ::size(&this->localVariables);
    if ((int)sVar3 <= local_1c) break;
    pvVar1 = std::
             vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
             ::operator[](&this->localVariables,(long)local_1c);
    pIVar2 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (pvVar1);
    Instruction::dump(pIVar2,out);
    local_1c = local_1c + 1;
  }
  local_20 = 1;
  while( true ) {
    sVar3 = std::
            vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
            ::size(&this->instructions);
    if ((int)sVar3 <= local_20) break;
    pvVar1 = std::
             vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
             ::operator[](&this->instructions,(long)local_20);
    pIVar2 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (pvVar1);
    Instruction::dump(pIVar2,out);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void dump(dxil_spv::Vector<unsigned int>& out) const
    {
        instructions[0]->dump(out);
        for (int i = 0; i < (int)localVariables.size(); ++i)
            localVariables[i]->dump(out);
        for (int i = 1; i < (int)instructions.size(); ++i)
            instructions[i]->dump(out);
    }